

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void compute_upvalue_attributes(Proc *proc)

{
  uint uVar1;
  _Bool local_39;
  uint idx;
  _Bool in_stack;
  PtrListIterator symiter__;
  AstNode *this_function;
  LuaSymbol *sym;
  Proc *proc_local;
  
  symiter__._16_8_ = proc->function_expr;
  raviX_ptrlist_forward_iterator
            ((PtrListIterator *)&idx,
             (PtrList *)(((AstNode *)symiter__._16_8_)->field_2).function_expr.upvalues);
  this_function = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&idx);
  while (this_function != (AstNode *)0x0) {
    local_39 = false;
    uVar1 = get_upvalue_idx(proc,(LuaSymbol *)this_function,&local_39);
    (this_function->field_2).table_expr.inferred_type_code =
         (this_function->field_2).table_expr.inferred_type_code & 0xfffeffff |
         (uint)((local_39 & 1U) != 0) << 0x10;
    (this_function->field_2).table_expr.inferred_type_code =
         (this_function->field_2).table_expr.inferred_type_code & 0x1ffff | uVar1 << 0x11;
    this_function = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&idx);
  }
  return;
}

Assistant:

static void compute_upvalue_attributes(Proc *proc)
{
	LuaSymbol *sym;
	AstNode *this_function = proc->function_expr;
	FOR_EACH_PTR(this_function->function_expr.upvalues, LuaSymbol, sym)
	{
		bool in_stack = false;
		unsigned idx = get_upvalue_idx(proc, sym, &in_stack);
		sym->upvalue.is_in_parent_stack = in_stack ? 1 : 0;
		sym->upvalue.parent_upvalue_index = idx; // TODO check overflow?
	}
	END_FOR_EACH_PTR(sym)
}